

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopInvariantCodeMotion.cpp
# Opt level: O2

void __thiscall wasm::LoopInvariantCodeMotion::visitLoop(LoopInvariantCodeMotion *this,Loop *loop)

{
  size_t *this_00;
  int *piVar1;
  int iVar2;
  PassRunner *pPVar3;
  Expression **ppEVar4;
  pointer ppLVar5;
  pointer ppLVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  iterator __begin7;
  size_t __n;
  undefined1 auVar9 [8];
  Expression *pEVar10;
  Block *this_01;
  ulong extraout_RDX;
  ulong uVar11;
  ulong extraout_RDX_00;
  pointer ppLVar12;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  LoopInvariantCodeMotion *this_02;
  ulong index;
  char cVar13;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_03;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  undefined1 local_520 [8];
  EffectAnalyzer effectsSoFar;
  EffectAnalyzer loopEffects;
  FindAll<wasm::LocalSet> finder;
  long local_220;
  long local_1c0;
  long local_190;
  char local_188;
  char local_187;
  char local_186;
  char local_185;
  char local_184;
  char local_183;
  char local_182;
  char local_181;
  char local_17e;
  char local_17d;
  long local_138;
  long local_108;
  undefined1 local_100 [8];
  LoopSets loopSets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numSetsForIndex;
  LocalSet *set_1;
  undefined1 local_90 [8];
  FindAll<wasm::LocalSet> currSets;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> movedCode;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> work;
  Expression *local_38;
  Expression *curr;
  
  currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar3 = (this->
           super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
           ).super_Pass.runner;
  effectsSoFar._0_8_ =
       (this->
       super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
       ).
       super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
       .
       super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
       .
       super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
       .currModule;
  local_520[0] = (pPVar3->options).ignoreImplicitTraps;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.localsRead;
  local_520[1] = (pPVar3->options).trapsNeverHappen;
  effectsSoFar.module._0_4_ = (((Module *)effectsSoFar._0_8_)->features).features;
  effectsSoFar.module._4_2_ = 0;
  effectsSoFar.localsRead._M_t._M_impl._0_4_ = 0;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.localsWritten;
  effectsSoFar.localsWritten._M_t._M_impl._0_4_ = 0;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.mutableGlobalsRead;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.globalsWritten;
  effectsSoFar.globalsWritten._M_t._M_impl._0_4_ = 0;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.breakTargets;
  effectsSoFar.breakTargets._M_t._M_impl._0_4_ = 0;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  effectsSoFar.readsMemory = false;
  effectsSoFar.writesMemory = false;
  effectsSoFar.readsTable = false;
  effectsSoFar.writesTable = false;
  effectsSoFar.trap = false;
  effectsSoFar.implicitTrap = false;
  effectsSoFar.isAtomic = false;
  effectsSoFar.throws_ = false;
  effectsSoFar._228_4_ = 0;
  effectsSoFar.tryDepth._0_7_ = 0;
  effectsSoFar._239_4_ = 0;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.delegateTargets;
  effectsSoFar.delegateTargets._M_t._M_impl._0_4_ = 0;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &pPVar3->options,(Module *)effectsSoFar._0_8_,(Expression *)loop);
  __n = Function::getNumLocals
                  ((this->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                   ).
                   super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                   .
                   super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                   .
                   super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                   .currFunction);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&loopSets._M_h._M_single_bucket,
             __n,(allocator_type *)
                 &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_100 = (undefined1  [8])&loopSets._M_h._M_rehash_policy._M_next_resize;
  loopSets._M_h._M_buckets = (__buckets_ptr)0x1;
  loopSets._M_h._M_bucket_count = 0;
  loopSets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  loopSets._M_h._M_element_count._0_4_ = 0x3f800000;
  loopSets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  loopSets._M_h._M_rehash_policy._4_4_ = 0;
  loopSets._M_h._M_rehash_policy._M_next_resize = 0;
  FindAll<wasm::LocalSet>::FindAll
            ((FindAll<wasm::LocalSet> *)
             &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Expression *)loop);
  work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  for (; (pointer)loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
         finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
         .super__Vector_impl_data._M_start;
      loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) {
    auStack_58 = *(undefined1 (*) [8])
                  loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    piVar1 = (int *)((long)&(loopSets._M_h._M_single_bucket)->_M_nxt +
                    (ulong)((LocalSet *)auStack_58)->index * 4);
    *piVar1 = *piVar1 + 1;
    std::__detail::
    _Insert_base<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_100,(value_type *)auStack_58);
  }
  std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
            ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
             &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&loop->body
  ;
  std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
  emplace_back<wasm::Expression**>
            ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)auStack_58,
             (Expression ***)
             &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this_00 = &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar11 = extraout_RDX;
  this_02 = (LoopInvariantCodeMotion *)
            work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_00a7dee6:
  do {
    if (auStack_58 ==
        (undefined1  [8])
        work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_00a7e213:
      if (currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)(this_02->
                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                     ).
                     super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                     .
                     super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                     .
                     super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                     .currModule;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar11;
        this_01 = Builder::
                  makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                            ((Builder *)
                             &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &currSets.list.
                              super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,type);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(this_01->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)loop);
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)
             (loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id;
        Block::finalize(this_01,type_,Unknown);
        ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
        ::replaceCurrent(&(this->
                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                          ).
                          super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                         ,(Expression *)this_01);
      }
      std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                 auStack_58);
      std::
      _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_100);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &loopSets._M_h._M_single_bucket);
      EffectAnalyzer::~EffectAnalyzer
                ((EffectAnalyzer *)
                 &effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_520);
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 &currSets.list.
                  super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    ppEVar4 = work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
              _M_impl.super__Vector_impl_data._M_start[-1];
    work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
    super__Vector_impl_data._M_start =
         work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
         super__Vector_impl_data._M_start + -1;
    local_38 = *ppEVar4;
    if (local_38->_id != BlockId) {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)this_00,
                 &((this_02->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this_02->
                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                 ).
                 super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                 .
                 super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                 .
                 super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                 .currModule,local_38);
      if ((((finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_finish._4_1_ == '\0') && (local_17d == '\0')) &&
          (local_108 == 0)) && (local_138 == 0)) {
        bVar8 = interestingToMove(this_02,local_38);
        if (bVar8) {
          cVar13 = '\x01';
          if ((((local_190 == 0) && (local_187 == '\0')) &&
              ((local_185 == '\0' && ((local_183 == '\0' && (local_181 == '\0')))))) &&
             ((local_17e == '\0' &&
              ((finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                _M_impl.super__Vector_impl_data._M_finish._5_1_ == '\0' &&
               (bVar8 = EffectAnalyzer::invalidates
                                  ((EffectAnalyzer *)local_520,(EffectAnalyzer *)this_00), !bVar8)))
              ))) {
            if (((local_1c0 == 0) &&
                (((local_188 == '\0' && (local_186 == '\0')) && (local_184 == '\0')))) &&
               (local_182 == '\0')) {
              cVar13 = '\0';
            }
            else if ((((loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_right == (_Base_ptr)0x0) &&
                      (loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                       _1_1_ == '\0')) &&
                     ((loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                       _3_1_ == '\0' &&
                      ((loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                        _5_1_ == '\0' &&
                       (loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                        _7_1_ == '\0')))))) && (loopEffects.readsTable == false)) {
              cVar13 = loopEffects.module._5_1_;
            }
          }
          if ((cVar13 == '\0' &&
               (loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
                (_Base_ptr)0x0 && loopEffects.writesTable == false)) &&
             ((local_220 == 0 ||
              (bVar8 = hasGetDependingOnLoopSet(this_02,local_38,(LoopSets *)local_100), !bVar8))))
          {
            FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)local_90,local_38);
            ppLVar5 = currSets.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            for (auVar9 = local_90; auVar7 = local_90,
                auVar9 != (undefined1  [8])
                          currSets.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                auVar9 = (undefined1  [8])((long)auVar9 + 8)) {
              iVar2 = *(int *)((long)&(loopSets._M_h._M_single_bucket)->_M_nxt +
                              (ulong)(*(LocalSet **)auVar9)->index * 4);
              if (iVar2 == 0) {
                __assert_fail("numSetsForIndex[set->index] > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LoopInvariantCodeMotion.cpp"
                              ,0x92,"void wasm::LoopInvariantCodeMotion::visitLoop(Loop *)");
              }
              *(int *)((long)&(loopSets._M_h._M_single_bucket)->_M_nxt +
                      (ulong)(*(LocalSet **)auVar9)->index * 4) = iVar2 + -1;
            }
LAB_00a7e144:
            ppLVar12 = (pointer)auVar7;
            if (ppLVar12 !=
                currSets.list.
                super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                super__Vector_impl_data._M_start) break;
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                       &currSets.list.
                        super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,&local_38);
            pEVar10 = (Expression *)
                      MixedArena::alloc<wasm::Nop>
                                ((MixedArena *)
                                 (work.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage[0x25] + 0x40));
            ppLVar6 = currSets.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            *ppEVar4 = pEVar10;
            for (auVar9 = local_90; auVar9 != (undefined1  [8])ppLVar6;
                auVar9 = (undefined1  [8])((long)auVar9 + 8)) {
              numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)auVar9;
              std::
              _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_100,
                         &numSetsForIndex.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
            }
            goto LAB_00a7e170;
          }
        }
        goto LAB_00a7e185;
      }
      EffectAnalyzer::~EffectAnalyzer
                ((EffectAnalyzer *)
                 &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      uVar11 = extraout_RDX_02;
      goto LAB_00a7e213;
    }
    index = (ulong)(uint)local_38[2].type.id;
    this_03 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(local_38 + 2)
    ;
    while (index = index - 1, index != 0xffffffffffffffff) {
      loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             (this_03,index);
      std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
      emplace_back<wasm::Expression**>
                ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)auStack_58,
                 (Expression ***)this_00);
      uVar11 = extraout_RDX_00;
    }
  } while( true );
  auVar9 = local_90;
  auVar7 = (undefined1  [8])(ppLVar12 + 1);
  if (*(int *)((long)&(loopSets._M_h._M_single_bucket)->_M_nxt + (ulong)(*ppLVar12)->index * 4) != 0
     ) goto LAB_00a7e16b;
  goto LAB_00a7e144;
LAB_00a7e16b:
  for (; auVar9 != (undefined1  [8])
                   currSets.list.
                   super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                   super__Vector_impl_data._M_start; auVar9 = (undefined1  [8])((long)auVar9 + 8)) {
    piVar1 = (int *)((long)&(loopSets._M_h._M_single_bucket)->_M_nxt +
                    (ulong)(*(LocalSet **)auVar9)->index * 4);
    *piVar1 = *piVar1 + 1;
  }
LAB_00a7e170:
  std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
            ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_90);
  this_02 = (LoopInvariantCodeMotion *)
            work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (ppLVar12 != ppLVar5) {
LAB_00a7e185:
    EffectAnalyzer::mergeIn((EffectAnalyzer *)local_520,(EffectAnalyzer *)this_00);
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)this_00);
  uVar11 = extraout_RDX_01;
  goto LAB_00a7dee6;
}

Assistant:

void visitLoop(Loop* loop) {
    // We accumulate all the code we can move out, and will place it
    // in a block just preceding the loop.
    std::vector<Expression*> movedCode;
    // Accumulate effects of things we can't move out - things
    // we move out later must cross them, so we must verify it
    // is ok to do so.
    EffectAnalyzer effectsSoFar(getPassOptions(), *getModule());
    // The loop's total effects also matter. For example, a store
    // in the loop means we can't move a load outside.
    // FIXME: we look at the loop "tail" area too, after the last
    //        possible branch back, which can cause false positives
    //        for bad effect interactions.
    EffectAnalyzer loopEffects(getPassOptions(), *getModule(), loop);
    // Note all the sets in each loop, and how many per index. Currently
    // EffectAnalyzer can't do that, and we need it to know if we
    // can move a set out of the loop (if there is another set
    // still there, we can't). Another possible option here is for
    // LocalGraph to track interfering sets. TODO
    // FIXME: also the loop tail issue from above.
    auto numLocals = getFunction()->getNumLocals();
    std::vector<Index> numSetsForIndex(numLocals);
    LoopSets loopSets;
    {
      FindAll<LocalSet> finder(loop);
      for (auto* set : finder.list) {
        numSetsForIndex[set->index]++;
        loopSets.insert(set);
      }
    }
    // Walk along the loop entrance, while all the code there
    // is executed unconditionally. That is the code we want to
    // move out - anything that might or might not be executed
    // may be best left alone anyhow.
    std::vector<Expression**> work;
    work.push_back(&loop->body);
    while (!work.empty()) {
      auto** currp = work.back();
      work.pop_back();
      auto* curr = *currp;
      // Look into blocks.
      if (auto* block = curr->dynCast<Block>()) {
        auto& list = block->list;
        Index i = list.size();
        while (i > 0) {
          i--;
          work.push_back(&list[i]);
        }
        continue;
        // Note that if the block had a merge at the end, we would have seen
        // a branch to it anyhow, so we would stop before that point anyhow.
      }
      // If this may branch, we are done.
      EffectAnalyzer effects(getPassOptions(), *getModule(), curr);
      if (effects.transfersControlFlow()) {
        break;
      }
      if (interestingToMove(curr)) {
        // Let's see if we can move this out.
        // Global state changes would prevent this - we might end up
        // executing them just once.
        // And we must also move across anything not moved out already,
        // so check for issues there too.
        // The rest of the loop's effects matter too, we must also
        // take into account global state like interacting loads and
        // stores.
        bool unsafeToMove = effects.writesGlobalState() ||
                            effectsSoFar.invalidates(effects) ||
                            (effects.readsMutableGlobalState() &&
                             loopEffects.writesGlobalState());
        // TODO: look into optimizing this with exceptions. for now, disallow
        if (effects.throws() || loopEffects.throws()) {
          unsafeToMove = true;
        }
        if (!unsafeToMove) {
          // So far so good. Check if our local dependencies are all
          // outside of the loop, in which case everything is good -
          // either they are before the loop and constant for us, or
          // they are after and don't matter.
          if (effects.localsRead.empty() ||
              !hasGetDependingOnLoopSet(curr, loopSets)) {
            // We have checked if our gets are influenced by sets in the loop,
            // and must also check if our sets interfere with them. To do so,
            // assume temporarily that we are moving curr out; see if any sets
            // remain for its indexes.
            FindAll<LocalSet> currSets(curr);
            for (auto* set : currSets.list) {
              assert(numSetsForIndex[set->index] > 0);
              numSetsForIndex[set->index]--;
            }
            bool canMove = true;
            for (auto* set : currSets.list) {
              if (numSetsForIndex[set->index] > 0) {
                canMove = false;
                break;
              }
            }
            if (!canMove) {
              // We failed to move the code, undo those changes.
              for (auto* set : currSets.list) {
                numSetsForIndex[set->index]++;
              }
            } else {
              // We can move it! Leave the changes, move the code, and update
              // loopSets.
              movedCode.push_back(curr);
              *currp = Builder(*getModule()).makeNop();
              for (auto* set : currSets.list) {
                loopSets.erase(set);
              }
              continue;
            }
          }
        }
      }
      // We did not move this item. Accumulate its effects.
      effectsSoFar.mergeIn(effects);
    }
    // If we moved the code out, finish up by emitting it
    // outside of the loop.
    // Note that this works with nested loops - after moving outside
    // of an inner loop, we can encounter it again in an outer loop,
    // and move it further outside, without requiring any extra pass.
    if (!movedCode.empty()) {
      // Finish the moving by emitting the code outside.
      Builder builder(*getModule());
      auto* ret = builder.makeBlock(movedCode);
      ret->list.push_back(loop);
      ret->finalize(loop->type);
      replaceCurrent(ret);
      // Note that we do not need to modify the localGraph - we keep
      // each get in a position to be influenced by exactly the same
      // sets as before.
    }
  }